

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O0

string * __thiscall
mjs::not_callable_exception::format_error_message_abi_cxx11_
          (string *__return_storage_ptr__,not_callable_exception *this,value *v)

{
  value_type vVar1;
  object_ptr *this_00;
  object local_1b0;
  ostringstream local_190 [8];
  ostringstream oss;
  value *v_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  vVar1 = value::type((value *)this);
  if (vVar1 == object) {
    this_00 = value::object_value((value *)this);
    gc_heap_ptr<mjs::object>::operator->(this_00);
    object::class_name(&local_1b0);
    mjs::operator<<((ostream *)local_190,(string *)&local_1b0);
    string::~string((string *)&local_1b0);
  }
  else {
    vVar1 = value::type((value *)this);
    mjs::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_190,vVar1);
  }
  std::operator<<((ostream *)local_190," is not a function");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string not_callable_exception::format_error_message(const value& v) {
    std::ostringstream oss;
    if (v.type() == value_type::object) {
        oss << v.object_value()->class_name();
    } else {
        oss << v.type();
    }
    oss << " is not a function";
    return oss.str();
}